

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O0

int amqp_tcp_socket_close(void *base,amqp_socket_close_enum force)

{
  int iVar1;
  long in_RDI;
  amqp_tcp_socket_t *self;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 8) == -1) {
    local_4 = -0x11;
  }
  else {
    iVar1 = amqp_os_socket_close(0);
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 8) = 0xffffffff;
      local_4 = 0;
    }
    else {
      local_4 = -9;
    }
  }
  return local_4;
}

Assistant:

static int amqp_tcp_socket_close(void *base,
                                 AMQP_UNUSED amqp_socket_close_enum force) {
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  if (-1 == self->sockfd) {
    return AMQP_STATUS_SOCKET_CLOSED;
  }

  if (amqp_os_socket_close(self->sockfd)) {
    return AMQP_STATUS_SOCKET_ERROR;
  }
  self->sockfd = -1;

  return AMQP_STATUS_OK;
}